

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O0

ans_msb_decode * ans_msb_decode::load(uint8_t *in_u8)

{
  uint uVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  uint64_t uVar8;
  ans_msb_decode *in_RDI;
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [64];
  uint32_t except_bytes;
  uint32_t k;
  value_type cur_freq;
  size_t sym;
  uint32_t cur_base;
  uint64_t tmp;
  size_type max_sym;
  ans_msb_decode *model;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint uVar11;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ans_msb_decode *__new_size;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint local_78;
  ulong local_70;
  int local_64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar12;
  undefined1 extraout_var [56];
  
  auVar9 = in_ZMM0._0_16_;
  uVar12 = 0;
  __new_size = in_RDI;
  ans_msb_decode((ans_msb_decode *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  ans_load_interp((uint8_t *)CONCAT17(uVar12,in_stack_ffffffffffffffe8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&in_RDI->nfreqs,&local_30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&in_RDI->nfreqs);
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  __first._M_current._4_4_ = in_stack_ffffffffffffff64;
  __first._M_current._0_4_ = in_stack_ffffffffffffff60;
  __last._M_current._4_4_ = in_stack_ffffffffffffff5c;
  __last._M_current._0_4_ = in_stack_ffffffffffffff58;
  iVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (__first,__last,0);
  in_RDI->frame_size = (long)iVar2;
  in_RDI->frame_mask = in_RDI->frame_size - 1;
  auVar9 = vcvtusi2sd_avx512f(auVar9,in_RDI->frame_size);
  auVar10._0_8_ = log2(auVar9._0_8_);
  auVar10._8_56_ = extraout_var;
  uVar8 = vcvttsd2usi_avx512f(auVar10._0_16_);
  in_RDI->frame_log2 = uVar8;
  std::vector<dec_entry_msb,_std::allocator<dec_entry_msb>_>::resize
            ((vector<dec_entry_msb,_std::allocator<dec_entry_msb>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),(size_type)__new_size);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->nfreqs);
  local_64 = 0;
  for (local_70 = 0; local_70 <= sVar5 - 1; local_70 = local_70 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->nfreqs,local_70);
    uVar1 = *pvVar6;
    for (local_78 = 0; local_78 < uVar1; local_78 = local_78 + 1) {
      uVar3 = ans_msb_exception_bytes((uint32_t)local_70);
      uVar11 = uVar1;
      pvVar7 = std::vector<dec_entry_msb,_std::allocator<dec_entry_msb>_>::operator[]
                         (&in_RDI->table,(ulong)(local_64 + local_78));
      pvVar7->freq = uVar11;
      uVar4 = ans_msb_undo_mapping((uint32_t)local_70);
      uVar4 = uVar4 + uVar3 * 0x40000000;
      pvVar7 = std::vector<dec_entry_msb,_std::allocator<dec_entry_msb>_>::operator[]
                         (&in_RDI->table,(ulong)(local_64 + local_78));
      pvVar7->mapped_num = uVar4;
      uVar11 = local_78;
      pvVar7 = std::vector<dec_entry_msb,_std::allocator<dec_entry_msb>_>::operator[]
                         (&in_RDI->table,(ulong)(local_64 + local_78));
      pvVar7->offset = uVar11;
    }
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->nfreqs,local_70);
    local_64 = *pvVar6 + local_64;
  }
  in_RDI->lower_bound = in_RDI->frame_size << 4;
  return __new_size;
}

Assistant:

static ans_msb_decode load(const uint8_t* in_u8)
    {
        ans_msb_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint32_t k = 0; k < cur_freq; k++) {
                uint32_t except_bytes = ans_msb_exception_bytes(sym);
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].mapped_num
                    = ans_msb_undo_mapping(sym) + (except_bytes << 30);
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }